

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

void Cipher::printPlain(vector<int,_std::allocator<int>_> *t)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  vector<int,_std::allocator<int>_> *in_RDI;
  value_type let;
  int i;
  int local_c;
  
  for (local_c = 0; sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDI),
      local_c < (int)sVar2; local_c = local_c + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_c);
    iVar1 = *pvVar3;
    if ((iVar1 < 1) || (0x1a < iVar1)) {
      if (iVar1 == 0x1b) {
        printf("_");
      }
      else {
        printf(".");
      }
    }
    else {
      printf("%c",(ulong)(iVar1 + 0x60));
    }
  }
  return;
}

Assistant:

void printPlain(const std::vector<TLetter> & t) {
        for (int i = 0; i < (int) t.size(); ++i) {
            const auto let = t[i];

            if (let >= 1 && let <= 26) {
                printf("%c", 'a' + let - 1);
            } else if (let == 27) {
                printf("_");
            } else {
                printf(".");
            }
        }
    }